

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O2

string * __thiscall
OpenMD::SelectionCompiler::getErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,SelectionCompiler *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->errorMessage);
  std::operator+(&local_50," : ",&this->errorLine);
  std::operator+(&local_30,&local_50,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if ((this->filename)._M_string_length != 0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getErrorMessage() {
      std::string strError = errorMessage;
      strError += " : " + errorLine + "\n";

      if (!filename.empty()) { strError += filename; }

      return strError;
    }